

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf-c.cc
# Opt level: O0

qpdf_oh qpdf_oh_get_key(qpdf_data qpdf,qpdf_oh oh,char *key)

{
  uint uVar1;
  anon_class_16_2_6314d5a9 local_70;
  function<unsigned_int_(QPDFObjectHandle_&)> local_60;
  function<unsigned_int_()> local_40;
  char *local_20;
  char *key_local;
  qpdf_data p_Stack_10;
  qpdf_oh oh_local;
  qpdf_data qpdf_local;
  
  local_20 = key;
  key_local._4_4_ = oh;
  p_Stack_10 = qpdf;
  return_null(&local_40,qpdf);
  local_70.qpdf = p_Stack_10;
  local_70.key = local_20;
  std::function<unsigned_int(QPDFObjectHandle&)>::function<qpdf_oh_get_key::__0,void>
            ((function<unsigned_int(QPDFObjectHandle&)> *)&local_60,&local_70);
  uVar1 = do_with_oh<unsigned_int>(qpdf,oh,&local_40,&local_60);
  std::function<unsigned_int_(QPDFObjectHandle_&)>::~function(&local_60);
  std::function<unsigned_int_()>::~function(&local_40);
  return uVar1;
}

Assistant:

qpdf_oh
qpdf_oh_get_key(qpdf_data qpdf, qpdf_oh oh, char const* key)
{
    return do_with_oh<qpdf_oh>(qpdf, oh, return_null(qpdf), [qpdf, key](QPDFObjectHandle& o) {
        QTC::TC("qpdf", "qpdf-c called qpdf_oh_get_key");
        return new_object(qpdf, o.getKey(key));
    });
}